

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

bool __thiscall Rml::DataParser::Match(DataParser *this,char c,bool skip_whitespace)

{
  ulong uVar1;
  char cVar2;
  
  if (this->reached_end == false) {
    cVar2 = (this->expression)._M_dataplus._M_p[this->index];
  }
  else {
    cVar2 = '\0';
  }
  if (cVar2 == c) {
    uVar1 = this->index + 1;
    this->index = uVar1;
    if ((this->expression)._M_string_length <= uVar1) {
      this->reached_end = true;
    }
    if (skip_whitespace) {
      SkipWhitespace(this);
    }
  }
  else {
    Expected(this,c);
  }
  return cVar2 == c;
}

Assistant:

bool Match(char c, bool skip_whitespace = true)
	{
		if (c == Look())
		{
			Next();
			if (skip_whitespace)
				SkipWhitespace();
			return true;
		}
		Expected(c);
		return false;
	}